

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void deqp::gls::AttributeLocationTestUtil::runTest
               (TestContext *testCtx,RenderContext *renderCtx,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *attributes,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preAttachBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preLinkBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *postLinkBind,bool relink,bool reattach,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *reattachAttributes)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint program_00;
  GLenum GVar4;
  deBool dVar5;
  TestLog *log_00;
  undefined4 extraout_var;
  size_type sVar6;
  const_reference pvVar7;
  string *psVar8;
  mapped_type_conflict *pmVar9;
  TestLog *log_01;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  MessageBuilder local_a18;
  pair<unsigned_int,_unsigned_int> local_898;
  MessageBuilder local_890;
  int local_70c;
  undefined1 local_708 [4];
  int bindNdx_2;
  MessageBuilder local_588;
  pair<unsigned_int,_unsigned_int> local_408;
  MessageBuilder local_400;
  MessageBuilder local_280;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  ScopedLogSection local_b0;
  ScopedLogSection section;
  int bindNdx_1;
  int local_94;
  undefined1 local_90 [4];
  int bindNdx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  activeBindings;
  GLuint GStack_58;
  bool isOk;
  pair<unsigned_int,_unsigned_int> shaders;
  deUint32 program;
  Functions *gl;
  TestLog *log;
  bool reattach_local;
  bool relink_local;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *postLinkBind_local;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *preLinkBind_local;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *preAttachBind_local;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *attributes_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  Functions *gl_00;
  
  log_00 = tcu::TestContext::getLog(testCtx);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            ((pair<unsigned_int,_unsigned_int> *)
             ((long)&activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_90);
  for (local_94 = 0;
      sVar6 = std::
              vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              ::size(preAttachBind), local_94 < (int)sVar6; local_94 = local_94 + 1) {
    pvVar7 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             ::operator[](preAttachBind,(long)local_94);
    dVar3 = Bind::getLocation(pvVar7);
    pvVar7 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             ::operator[](preAttachBind,(long)local_94);
    psVar8 = Bind::getAttributeName_abi_cxx11_(pvVar7);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)local_90,psVar8);
    *pmVar9 = dVar3;
  }
  for (section.m_log._0_4_ = 0; iVar2 = (int)section.m_log,
      sVar6 = std::
              vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              ::size(preLinkBind), iVar2 < (int)sVar6; section.m_log._0_4_ = (int)section.m_log + 1)
  {
    pvVar7 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             ::operator[](preLinkBind,(long)(int)section.m_log);
    dVar3 = Bind::getLocation(pvVar7);
    pvVar7 = std::
             vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             ::operator[](preLinkBind,(long)(int)section.m_log);
    psVar8 = Bind::getAttributeName_abi_cxx11_(pvVar7);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)local_90,psVar8);
    *pmVar9 = dVar3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Attributes",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Attribute information",&local_f9);
  tcu::ScopedLogSection::ScopedLogSection(&local_b0,log_00,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  log_01 = tcu::TestContext::getLog(testCtx);
  anon_unknown_1::logAttributes(log_01,attributes);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b0);
  tcu::TestLog::operator<<(&local_280,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [16])"Create program.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  program_00 = (*gl_00->createProgram)();
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"glCreateProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2cf);
  bVar1 = std::
          vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
          ::empty(preAttachBind);
  if (!bVar1) {
    anon_unknown_1::bindAttributes(log_00,gl_00,program_00,preAttachBind);
  }
  tcu::TestLog::operator<<(&local_400,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_400,(char (*) [38])"Create and attach shaders to program.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  bVar1 = anon_unknown_1::hasAttributeAliasing
                    (attributes,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)local_90);
  local_408 = anon_unknown_1::createAndAttachShaders(log_00,renderCtx,program_00,attributes,bVar1);
  std::pair<unsigned_int,_unsigned_int>::operator=
            ((pair<unsigned_int,_unsigned_int> *)
             ((long)&activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),&local_408
            );
  bVar1 = std::
          vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
          ::empty(preLinkBind);
  if (!bVar1) {
    anon_unknown_1::bindAttributes(log_00,gl_00,program_00,preLinkBind);
  }
  tcu::TestLog::operator<<(&local_588,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [14])"Link program.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_588);
  (*gl_00->linkProgram)(program_00);
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"glLinkProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2dd);
  anon_unknown_1::logProgram(log_00,gl_00,program_00);
  do {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (bVar1 = anon_unknown_1::getProgramLinkStatus(gl_00,program_00), !bVar1)) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"Program link failed","getProgramLinkStatus(gl, program)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                 ,0x2e0);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  bVar1 = anon_unknown_1::checkQuery
                    (log_00,gl_00,program_00,attributes,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)local_90);
  if (!bVar1) {
    activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  }
  bVar1 = std::
          vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
          ::empty(postLinkBind);
  if (!bVar1) {
    anon_unknown_1::bindAttributes(log_00,gl_00,program_00,postLinkBind);
    bVar1 = anon_unknown_1::checkQuery
                      (log_00,gl_00,program_00,attributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)local_90);
    if (!bVar1) {
      activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    }
  }
  if (relink) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_708,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_708,(char (*) [16])"Relink program.");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_708);
    (*gl_00->linkProgram)(program_00);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glLinkProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x2f1);
    anon_unknown_1::logProgram(log_00,gl_00,program_00);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) || (bVar1 = anon_unknown_1::getProgramLinkStatus(gl_00,program_00), !bVar1))
      {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x2f4);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    for (local_70c = 0; iVar2 = local_70c,
        sVar6 = std::
                vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                ::size(postLinkBind), iVar2 < (int)sVar6; local_70c = local_70c + 1) {
      pvVar7 = std::
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ::operator[](postLinkBind,(long)local_70c);
      dVar3 = Bind::getLocation(pvVar7);
      pvVar7 = std::
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ::operator[](postLinkBind,(long)local_70c);
      psVar8 = Bind::getAttributeName_abi_cxx11_(pvVar7);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_90,psVar8);
      *pmVar9 = dVar3;
    }
    bVar1 = anon_unknown_1::checkQuery
                      (log_00,gl_00,program_00,attributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)local_90);
    if (!bVar1) {
      activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    }
  }
  if (reattach) {
    (*gl_00->detachShader)
              (program_00,activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    (*gl_00->detachShader)(program_00,GStack_58);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glDetachShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x301);
    tcu::TestLog::operator<<(&local_890,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_890,(char (*) [38])"Create and attach shaders to program.");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_890);
    bVar1 = anon_unknown_1::hasAttributeAliasing
                      (reattachAttributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)local_90);
    local_898 = anon_unknown_1::createAndAttachShaders
                          (log_00,renderCtx,program_00,reattachAttributes,bVar1);
    tcu::TestLog::operator<<(&local_a18,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_a18,(char (*) [16])"Relink program.");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a18);
    (*gl_00->linkProgram)(program_00);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glLinkProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x308);
    anon_unknown_1::logProgram(log_00,gl_00,program_00);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) || (bVar1 = anon_unknown_1::getProgramLinkStatus(gl_00,program_00), !bVar1))
      {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x30b);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    bVar1 = anon_unknown_1::checkQuery
                      (log_00,gl_00,program_00,reattachAttributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)local_90);
    if (!bVar1) {
      activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    }
  }
  (*gl_00->deleteProgram)(program_00);
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"glDeleteProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x312);
  if ((activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_90);
  return;
}

Assistant:

void runTest (tcu::TestContext&			testCtx,
			glu::RenderContext&			renderCtx,
			const vector<Attribute>&	attributes,
			const vector<Bind>&			preAttachBind,
			const vector<Bind>&			preLinkBind,
			const vector<Bind>&			postLinkBind,
			bool						relink,
			bool						reattach = false,
			const vector<Attribute>&	reattachAttributes = vector<Attribute>())
{
	TestLog&					log			= testCtx.getLog();
	const glw::Functions&		gl			= renderCtx.getFunctions();
	deUint32					program		= 0;
	pair<deUint32, deUint32>	shaders;

	try
	{
		bool					isOk			= true;
		map<string, deUint32>	activeBindings;

		for (int bindNdx = 0; bindNdx < (int)preAttachBind.size(); bindNdx++)
			activeBindings[preAttachBind[bindNdx].getAttributeName()] = preAttachBind[bindNdx].getLocation();

		for (int bindNdx = 0; bindNdx < (int)preLinkBind.size(); bindNdx++)
			activeBindings[preLinkBind[bindNdx].getAttributeName()] = preLinkBind[bindNdx].getLocation();

		{
			tcu::ScopedLogSection section(log, "Attributes", "Attribute information");
			logAttributes(testCtx.getLog(), attributes);
		}

		log << TestLog::Message << "Create program." << TestLog::EndMessage;
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram()");

		if (!preAttachBind.empty())
			bindAttributes(log, gl, program, preAttachBind);

		log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
		shaders = createAndAttachShaders(log, renderCtx, program, attributes, hasAttributeAliasing(attributes, activeBindings));

		if (!preLinkBind.empty())
			bindAttributes(log, gl, program, preLinkBind);

		log << TestLog::Message << "Link program." << TestLog::EndMessage;

		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

		logProgram(log, gl, program);
		TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

		if (!checkQuery(log, gl, program, attributes, activeBindings))
			isOk = false;

		if (!postLinkBind.empty())
		{
			bindAttributes(log, gl, program, postLinkBind);

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (relink)
		{
			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			for (int bindNdx = 0; bindNdx < (int)postLinkBind.size(); bindNdx++)
				activeBindings[postLinkBind[bindNdx].getAttributeName()] = postLinkBind[bindNdx].getLocation();

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (reattach)
		{
			gl.detachShader(program, shaders.first);
			gl.detachShader(program, shaders.second);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader()");

			log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
			createAndAttachShaders(log, renderCtx, program, reattachAttributes, hasAttributeAliasing(reattachAttributes, activeBindings));

			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			if (!checkQuery(log, gl, program, reattachAttributes, activeBindings))
				isOk = false;
		}

		gl.deleteProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (isOk)
			testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		throw;
	}
}